

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.h
# Opt level: O2

char16 __thiscall Js::CharClassifier::SkipBiDirectionalChars(CharClassifier *this,char16 **pszRef)

{
  bool bVar1;
  char16 *pcVar2;
  
  pcVar2 = *pszRef;
  while( true ) {
    if (*pcVar2 == L'\0') {
      return L'\0';
    }
    bVar1 = IsBiDirectionalChar(this,(uint)(ushort)*pcVar2);
    if (!bVar1) break;
    pcVar2 = *pszRef + 1;
    *pszRef = pcVar2;
  }
  return **pszRef;
}

Assistant:

char16 SkipBiDirectionalChars(_In_z_ char16* &pszRef) const
        {
            while (*pszRef != '\0')
            {
                if (!IsBiDirectionalChar(*pszRef))
                {
                    return *pszRef;
                }

                pszRef++;
            }

            return '\0';
        }